

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O0

void __thiscall Js::DebuggerScope::EnsurePropertyListIsAllocated(DebuggerScope *this)

{
  List<Js::DebuggerScopeProperty,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  **ppLVar1;
  Recycler *pRVar2;
  List<Js::DebuggerScopeProperty,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *this_00;
  TrackAllocData local_38;
  DebuggerScope *local_10;
  DebuggerScope *this_local;
  
  local_10 = this;
  ppLVar1 = Memory::WriteBarrierPtr::operator_cast_to_List__
                      ((WriteBarrierPtr *)&this->scopeProperties);
  if (*ppLVar1 ==
      (List<Js::DebuggerScopeProperty,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
       *)0x0) {
    pRVar2 = this->recycler;
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_38,
               (type_info *)
               &JsUtil::
                List<Js::DebuggerScopeProperty,Memory::Recycler,false,Js::CopyRemovePolicy,DefaultComparer>
                ::typeinfo,0,0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
               ,0x1748);
    pRVar2 = Memory::Recycler::TrackAllocInfo(pRVar2,&local_38);
    this_00 = (List<Js::DebuggerScopeProperty,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
               *)new<Memory::Recycler>(0x30,pRVar2,0x43c4b0);
    JsUtil::
    List<Js::DebuggerScopeProperty,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
    ::List(this_00,this->recycler,4);
    Memory::
    WriteBarrierPtr<JsUtil::List<Js::DebuggerScopeProperty,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>_>
    ::operator=(&this->scopeProperties,this_00);
  }
  return;
}

Assistant:

void DebuggerScope::EnsurePropertyListIsAllocated()
    {
        if (this->scopeProperties == nullptr)
        {
            this->scopeProperties = RecyclerNew(this->recycler, DebuggerScopePropertyList, this->recycler);
        }
    }